

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::addInputArgumentConversions
          (TParseContext *this,TFunction *function,TIntermNode **arguments)

{
  TType *this_00;
  TIntermediate *this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  TIntermNode **ppTVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TIntermTyped *pTVar6;
  long lVar7;
  ulong uVar8;
  long *plVar3;
  
  iVar2 = (*(*arguments)->_vptr_TIntermNode[6])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar2) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      ppTVar5 = arguments;
      if (iVar2 != 1 && plVar3 != (long *)0x0) {
        lVar4 = (**(code **)(*plVar3 + 400))(plVar3);
        ppTVar5 = (TIntermNode **)(*(long *)(lVar4 + 8) + lVar7);
      }
      iVar2 = (*(*ppTVar5)->_vptr_TIntermNode[3])();
      pTVar6 = (TIntermTyped *)CONCAT44(extraout_var_00,iVar2);
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar8 & 0xffffffff);
      this_00 = *(TType **)(CONCAT44(extraout_var_01,iVar2) + 8);
      iVar2 = (*(pTVar6->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar6);
      bVar1 = TType::operator==(this_00,(TType *)CONCAT44(extraout_var_02,iVar2));
      if (!bVar1) {
        iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar8 & 0xffffffff);
        lVar4 = (**(code **)(**(long **)(CONCAT44(extraout_var_03,iVar2) + 8) + 0x50))();
        if (((*(uint *)(lVar4 + 8) & 0x7f) < 0x14) &&
           ((0xd0000U >> (*(uint *)(lVar4 + 8) & 0x1f) & 1) != 0)) {
          iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar8 & 0xffffffff);
          if ((*(byte *)(*(long *)(CONCAT44(extraout_var_04,iVar2) + 8) + 10) & 0x60) == 0) {
            this_01 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar8 & 0xffffffff);
            pTVar6 = TIntermediate::addConversion
                               (this_01,EOpFunctionCall,
                                *(TType **)(CONCAT44(extraout_var_05,iVar2) + 8),pTVar6);
            if (pTVar6 != (TIntermTyped *)0x0) {
              iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
              ppTVar5 = arguments;
              if (iVar2 != 1 && plVar3 != (long *)0x0) {
                lVar4 = (**(code **)(*plVar3 + 400))(plVar3);
                ppTVar5 = (TIntermNode **)(*(long *)(lVar4 + 8) + lVar7);
              }
              *ppTVar5 = &pTVar6->super_TIntermNode;
            }
          }
        }
      }
      uVar8 = uVar8 + 1;
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      lVar7 = lVar7 + 8;
    } while ((long)uVar8 < (long)iVar2);
  }
  return;
}

Assistant:

void TParseContext::addInputArgumentConversions(const TFunction& function, TIntermNode*& arguments) const
{
    TIntermAggregate* aggregate = arguments->getAsAggregate();

    // Process each argument's conversion
    for (int i = 0; i < function.getParamCount(); ++i) {
        // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
        // is the single argument itself or its children are the arguments.  Only one argument
        // means take 'arguments' itself as the one argument.
        TIntermTyped* arg = function.getParamCount() == 1 ? arguments->getAsTyped() : (aggregate ? aggregate->getSequence()[i]->getAsTyped() : arguments->getAsTyped());
        if (*function[i].type != arg->getType()) {
            if (function[i].type->getQualifier().isParamInput() &&
               !function[i].type->isCoopMat()) {
                // In-qualified arguments just need an extra node added above the argument to
                // convert to the correct type.
                arg = intermediate.addConversion(EOpFunctionCall, *function[i].type, arg);
                if (arg) {
                    if (function.getParamCount() == 1)
                        arguments = arg;
                    else {
                        if (aggregate)
                            aggregate->getSequence()[i] = arg;
                        else
                            arguments = arg;
                    }
                }
            }
        }
    }
}